

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall cfd::core::BlindFactor::BlindFactor(BlindFactor *this,BlindFactor *object)

{
  this->_vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00277010;
  ByteData256::ByteData256(&this->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data_,
             &(object->data_).data_);
  return;
}

Assistant:

BlindFactor::BlindFactor(const BlindFactor &object) { data_ = object.data_; }